

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

bool __thiscall TPZFMatrix<double>::Compare(TPZFMatrix<double> *this,TPZSavable *copy,bool override)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  stringstream sout;
  double local_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  if (copy == (TPZSavable *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(copy,&TPZSavable::typeinfo,&typeinfo,0);
  }
  if (lVar4 != 0) {
    bVar3 = TPZMatrix<double>::Compare(&this->super_TPZMatrix<double>,copy,false);
    lVar6 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol *
            (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    if (lVar6 < 1) {
      local_1d8 = 0.0;
    }
    else {
      local_1d8 = 0.0;
      lVar7 = 0;
      do {
        dVar1 = this->fElem[lVar7];
        dVar2 = *(double *)(*(long *)(lVar4 + 0x20) + lVar7 * 8);
        if (dVar1 != dVar2) {
          bVar3 = false;
        }
        if (NAN(dVar1) || NAN(dVar2)) {
          bVar3 = false;
        }
        local_1d8 = local_1d8 + ABS(dVar1 - dVar2);
        lVar7 = lVar7 + 1;
      } while (lVar6 - lVar7 != 0);
    }
    if (bVar3 != false) {
      return bVar3;
    }
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,
               "virtual bool TPZFMatrix<double>::Compare(TPZSavable *, bool) const [TVar = double]",
               0x52);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," did not compare ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," number different terms ",0x18);
    poVar5 = std::ostream::_M_insert<long>((long)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," number terms ",0xe);
    std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," difference in norm L1 ",0x17);
    std::ostream::_M_insert<double>(local_1d8);
    std::__cxx11::stringbuf::str();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1d0,local_1c8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(local_130);
    if (override) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.cpp"
                 ,0x903);
    }
  }
  return false;
}

Assistant:

bool TPZFMatrix<TVar>::Compare(TPZSavable *copy, bool override) const
{
    TPZFMatrix<TVar> *fmat = dynamic_cast<TPZFMatrix<TVar> *> (copy);
    if(!fmat) return false;
    
    bool matresult = TPZMatrix<TVar>::Compare(copy,false);
    int64_t nel = this->fRow*this->fCol;
    TVar diff=0.;
    int64_t numdif = 0;
    int64_t iel;
    for(iel=0; iel<nel; iel++)
    {
        if(fElem[iel] != fmat->fElem[iel])
        {
            matresult = false;
            numdif++;
        }
        TVar exp = fElem[iel]-fmat->fElem[iel];
        diff += fabs(exp);
    }
    if(!matresult)
    {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << " did not compare ";
        sout << " number different terms " << numdif << " number terms " << this->fRow*this->fCol;
        sout << " difference in norm L1 " << diff;
        LOGPZ_ERROR(loggerCheck,sout.str())
    }
    if(!matresult && override)
    {
        DebugStop();
    }
    return matresult;
}